

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

int __thiscall
Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::remove
          (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,char *__filename)

{
  bool bVar1;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *pLVar2;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *tl;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *next;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *current;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *result;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  SelectedLiteral *in_stack_ffffffffffffff28;
  SelectedLiteral *in_stack_ffffffffffffff30;
  SelectedLiteral *l;
  SelectedLiteral local_a0;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_70;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_68;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_60;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_18;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *local_10;
  int local_8;
  
  local_18 = (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)__filename;
  local_10 = this;
  bVar1 = isEmpty((List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)__filename);
  if (bVar1) {
    pLVar2 = empty();
    local_8 = (int)pLVar2;
  }
  else {
    head(in_stack_ffffffffffffff18);
    bVar1 = Kernel::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42938d);
    if (bVar1) {
      local_60 = tail(local_18);
      if (local_18 != (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x0) {
        ~List((List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x4293c9);
        operator_delete(in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
      }
      local_8 = (int)local_60;
    }
    else {
      pLVar2 = tail(local_18);
      bVar1 = isEmpty(pLVar2);
      if (bVar1) {
        local_8 = (int)local_18;
      }
      else {
        local_68 = local_18;
        local_70 = tail(local_18);
        do {
          l = &local_a0;
          head(in_stack_ffffffffffffff18);
          bVar1 = Kernel::operator==(l,in_stack_ffffffffffffff28);
          Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x429498);
          if (bVar1) {
            pLVar2 = local_68;
            tl = tail(local_70);
            setTail(pLVar2,tl);
            if (local_70 != (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x0) {
              ~List((List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x4294e0);
              operator_delete(pLVar2,(size_t)in_stack_ffffffffffffff18);
            }
            local_8 = (int)local_18;
            return local_8;
          }
          local_68 = local_70;
          local_70 = tail(local_70);
          bVar1 = isEmpty(local_70);
        } while (!bVar1);
        local_8 = (int)local_18;
      }
    }
  }
  return local_8;
}

Assistant:

static List* remove (C elem, List* l)
  {
    if (isEmpty(l)) return empty();

    if (l->head() == elem) {
      List* result = l->tail();
      delete l;
      return result;
    }
    if (isEmpty(l->tail())) return l;

    List* current = l;
    List* next = l->tail();

    for (;;) {
      if (next->head() == elem) { // element found
        current->setTail(next->tail());
        delete next;
        return l;
      }
      current = next;
      next = next->tail();
      if (isEmpty(next)) return l;
    }
  }